

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_test.cc
# Opt level: O0

void __thiscall leveldb::_Test_ReopenAppendableFile::_Run(_Test_ReopenAppendableFile *this)

{
  Env *pEVar1;
  long *plVar2;
  Status local_fc8;
  allocator local_fb9;
  string local_fb8 [32];
  Tester local_f98;
  Status local_df8;
  Tester local_df0;
  Status local_c50;
  Tester local_c48;
  Slice local_aa8;
  Status local_a98;
  Tester local_a90;
  Status local_8f0;
  Tester local_8e8;
  Status local_748;
  Tester local_740;
  Slice local_5a0;
  Status local_590;
  Tester local_588;
  allocator local_3e1;
  string local_3e0 [8];
  string data;
  Status local_3c0;
  Tester local_3b8;
  long *local_218;
  WritableFile *appendable_file;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208 [8];
  string test_file_name;
  Status local_1e8 [3];
  Tester local_1d0;
  string local_30 [8];
  string test_dir;
  _Test_ReopenAppendableFile *this_local;
  
  std::__cxx11::string::string(local_30);
  test::Tester::Tester
            (&local_1d0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/env_test.cc"
             ,0xc9);
  pEVar1 = (this->super_EnvTest).env_;
  (*pEVar1->_vptr_Env[0x11])(local_1e8,pEVar1,local_30);
  test::Tester::IsOk(&local_1d0,local_1e8);
  Status::~Status(local_1e8);
  test::Tester::~Tester(&local_1d0);
  std::operator+(local_208,(char *)local_30);
  pEVar1 = (this->super_EnvTest).env_;
  (*pEVar1->_vptr_Env[8])(&appendable_file,pEVar1,local_208);
  Status::~Status((Status *)&appendable_file);
  test::Tester::Tester
            (&local_3b8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/env_test.cc"
             ,0xce);
  pEVar1 = (this->super_EnvTest).env_;
  (*pEVar1->_vptr_Env[5])(&local_3c0,pEVar1,local_208,&local_218);
  test::Tester::IsOk(&local_3b8,&local_3c0);
  Status::~Status(&local_3c0);
  test::Tester::~Tester(&local_3b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3e0,"hello world!",&local_3e1);
  std::allocator<char>::~allocator((allocator<char> *)&local_3e1);
  test::Tester::Tester
            (&local_588,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/env_test.cc"
             ,0xd0);
  plVar2 = local_218;
  Slice::Slice(&local_5a0,(string *)local_3e0);
  (**(code **)(*plVar2 + 0x10))(&local_590,plVar2,&local_5a0);
  test::Tester::IsOk(&local_588,&local_590);
  Status::~Status(&local_590);
  test::Tester::~Tester(&local_588);
  test::Tester::Tester
            (&local_740,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/env_test.cc"
             ,0xd1);
  (**(code **)(*local_218 + 0x18))(&local_748);
  test::Tester::IsOk(&local_740,&local_748);
  Status::~Status(&local_748);
  test::Tester::~Tester(&local_740);
  if (local_218 != (long *)0x0) {
    (**(code **)(*local_218 + 8))();
  }
  test::Tester::Tester
            (&local_8e8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/env_test.cc"
             ,0xd4);
  pEVar1 = (this->super_EnvTest).env_;
  (*pEVar1->_vptr_Env[5])(&local_8f0,pEVar1,local_208,&local_218);
  test::Tester::IsOk(&local_8e8,&local_8f0);
  Status::~Status(&local_8f0);
  test::Tester::~Tester(&local_8e8);
  std::__cxx11::string::operator=(local_3e0,"42");
  test::Tester::Tester
            (&local_a90,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/env_test.cc"
             ,0xd6);
  plVar2 = local_218;
  Slice::Slice(&local_aa8,(string *)local_3e0);
  (**(code **)(*plVar2 + 0x10))(&local_a98,plVar2,&local_aa8);
  test::Tester::IsOk(&local_a90,&local_a98);
  Status::~Status(&local_a98);
  test::Tester::~Tester(&local_a90);
  test::Tester::Tester
            (&local_c48,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/env_test.cc"
             ,0xd7);
  (**(code **)(*local_218 + 0x18))(&local_c50);
  test::Tester::IsOk(&local_c48,&local_c50);
  Status::~Status(&local_c50);
  test::Tester::~Tester(&local_c48);
  if (local_218 != (long *)0x0) {
    (**(code **)(*local_218 + 8))();
  }
  test::Tester::Tester
            (&local_df0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/env_test.cc"
             ,0xda);
  ReadFileToString((leveldb *)&local_df8,(this->super_EnvTest).env_,local_208,(string *)local_3e0);
  test::Tester::IsOk(&local_df0,&local_df8);
  Status::~Status(&local_df8);
  test::Tester::~Tester(&local_df0);
  test::Tester::Tester
            (&local_f98,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/env_test.cc"
             ,0xdb);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_fb8,"hello world!42",&local_fb9);
  test::Tester::IsEq<std::__cxx11::string,std::__cxx11::string>
            (&local_f98,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_fb8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3e0);
  std::__cxx11::string::~string(local_fb8);
  std::allocator<char>::~allocator((allocator<char> *)&local_fb9);
  test::Tester::~Tester(&local_f98);
  pEVar1 = (this->super_EnvTest).env_;
  (*pEVar1->_vptr_Env[8])(&local_fc8,pEVar1,local_208);
  Status::~Status(&local_fc8);
  std::__cxx11::string::~string(local_3e0);
  std::__cxx11::string::~string((string *)local_208);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

TEST(EnvTest, ReopenAppendableFile) {
  std::string test_dir;
  ASSERT_OK(env_->GetTestDirectory(&test_dir));
  std::string test_file_name = test_dir + "/reopen_appendable_file.txt";
  env_->DeleteFile(test_file_name);

  WritableFile* appendable_file;
  ASSERT_OK(env_->NewAppendableFile(test_file_name, &appendable_file));
  std::string data("hello world!");
  ASSERT_OK(appendable_file->Append(data));
  ASSERT_OK(appendable_file->Close());
  delete appendable_file;

  ASSERT_OK(env_->NewAppendableFile(test_file_name, &appendable_file));
  data = "42";
  ASSERT_OK(appendable_file->Append(data));
  ASSERT_OK(appendable_file->Close());
  delete appendable_file;

  ASSERT_OK(ReadFileToString(env_, test_file_name, &data));
  ASSERT_EQ(std::string("hello world!42"), data);
  env_->DeleteFile(test_file_name);
}